

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  size_t nblimbs;
  
  iVar2 = 0;
  if (X != Y) {
    if (Y->p == (mbedtls_mpi_uint *)0x0) {
      mbedtls_mpi_free(X);
      iVar2 = 0;
    }
    else {
      sVar3 = Y->n + 1;
      do {
        if (sVar3 == 2) {
          nblimbs = 1;
          break;
        }
        nblimbs = sVar3 - 1;
        lVar1 = sVar3 - 2;
        sVar3 = nblimbs;
      } while (Y->p[lVar1] == 0);
      X->s = Y->s;
      iVar2 = mbedtls_mpi_grow(X,nblimbs);
      if (iVar2 == 0) {
        memset(X->p,0,X->n << 3);
        memcpy(X->p,Y->p,nblimbs << 3);
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_copy( mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    int ret;
    size_t i;

    if( X == Y )
        return( 0 );

    if( Y->p == NULL )
    {
        mbedtls_mpi_free( X );
        return( 0 );
    }

    for( i = Y->n - 1; i > 0; i-- )
        if( Y->p[i] != 0 )
            break;
    i++;

    X->s = Y->s;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i ) );

    memset( X->p, 0, X->n * ciL );
    memcpy( X->p, Y->p, i * ciL );

cleanup:

    return( ret );
}